

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

void soul::ASTUtilities::removeModulesWithSpecialisationParams(Namespace *ns)

{
  int iVar1;
  undefined4 extraout_var;
  Namespace *ns_00;
  undefined8 *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ptr<soul::AST::Namespace> sub;
  pool_ptr<soul::AST::Namespace> local_38;
  pool_ref<soul::AST::ModuleBase> local_30;
  undefined8 *puVar2;
  
  iVar1 = (*(ns->super_ModuleBase).super_ASTObject._vptr_ASTObject[0x18])();
  for (puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1); puVar2 != extraout_RDX;
      puVar2 = puVar2 + 1) {
    local_30.object = (ModuleBase *)*puVar2;
    cast<soul::AST::Namespace,soul::AST::ModuleBase>((soul *)&local_38,&local_30);
    if (local_38.object != (Namespace *)0x0) {
      ns_00 = pool_ptr<soul::AST::Namespace>::operator*(&local_38);
      removeModulesWithSpecialisationParams(ns_00);
    }
  }
  removeIf<std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>,soul::ASTUtilities::removeModulesWithSpecialisationParams(soul::AST::Namespace&)::_lambda(soul::pool_ref<soul::AST::ModuleBase>&)_1_>
            (&ns->subModules,(anon_class_1_0_00000001_for__M_pred *)&local_38);
  return;
}

Assistant:

static void removeModulesWithSpecialisationParams (AST::Namespace& ns)
    {
        for (auto& m : ns.getSubModules())
            if (auto sub = cast<AST::Namespace> (m))
                removeModulesWithSpecialisationParams (*sub);

        removeIf (ns.subModules,
                  [] (pool_ref<AST::ModuleBase>& m) { return ! m->getSpecialisationParameters().empty(); });
    }